

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O3

TestStatus *
vkt::wsi::anon_unknown_0::createSurfaceTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  VkInstance *ppVVar1;
  InstanceHelper instHelper;
  Move<vk::Handle<(vk::HandleType)25>_> local_248;
  Maybe<tcu::Vector<unsigned_int,_2>_> local_228;
  undefined4 local_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  NativeObjects local_208;
  InstanceHelper local_1e8;
  
  InstanceHelper::InstanceHelper(&local_1e8,context,wsiType,(VkAllocationCallbacks *)0x0);
  local_228.m_ptr = (Vector<unsigned_int,_2> *)0x0;
  NativeObjects::NativeObjects
            (&local_208,(Context *)context->m_testCtx->m_platform,&local_1e8.supportedExtensions,
             wsiType,&local_228);
  ::vk::wsi::createSurface
            (&local_248,&local_1e8.vki.super_InstanceInterface,
             local_1e8.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,wsiType,
             local_208.display.
             super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.ptr,
             local_208.window.
             super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.ptr,
             (VkAllocationCallbacks *)0x0);
  ppVVar1 = &local_248.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter.m_instance;
  local_218 = local_248.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter.m_instance.
              _0_4_;
  uStack_214 = local_248.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter.m_instance.
               _4_4_;
  uStack_210 = local_248.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter.m_allocator.
               _0_4_;
  uStack_20c = local_248.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter.m_allocator.
               _4_4_;
  local_228.m_ptr =
       (Vector<unsigned_int,_2> *)
       local_248.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.object.m_internal;
  local_228.field_1.m_align._0_4_ =
       local_248.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter.m_instanceIface._0_4_
  ;
  local_228.field_1.m_align._4_4_ =
       local_248.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter.m_instanceIface._4_4_
  ;
  local_248.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.object.m_internal =
       (deUint64)ppVVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,"Creating surface succeeded","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,
             local_248.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.object.m_internal,
             (undefined1 *)
             (CONCAT44(local_248.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter.
                       m_instanceIface._4_4_,
                       local_248.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter.
                       m_instanceIface._0_4_) +
             local_248.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.object.m_internal));
  if ((VkInstance *)
      local_248.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.object.m_internal != ppVVar1)
  {
    operator_delete((void *)local_248.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.object.
                            m_internal,
                    CONCAT44(local_248.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter
                             .m_instance._4_4_,
                             local_248.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter
                             .m_instance._0_4_) + 1);
  }
  if (local_228.m_ptr != (Vector<unsigned_int,_2> *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_228.field_1.m_align._4_4_,local_228.field_1.m_align._0_4_)
                + 0x68))
              ((long *)CONCAT44(local_228.field_1.m_align._4_4_,local_228.field_1.m_align._0_4_),
               CONCAT44(uStack_214,local_218),local_228.m_ptr,CONCAT44(uStack_20c,uStack_210));
  }
  (*(local_208.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data
    .ptr)->_vptr_Window[1])
            (local_208.window.
             super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.ptr);
  (**(code **)(*(long *)local_208.display.
                        super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.
                        m_data.ptr + 8))
            (local_208.display.
             super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.ptr);
  ::vk::InstanceDriver::~InstanceDriver(&local_1e8.vki);
  if (local_1e8.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object != (VkInstance)0x0) {
    (*local_1e8.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance)
              (local_1e8.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,
               local_1e8.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator);
  }
  local_1e8.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object = (VkInstance_s *)0x0;
  local_1e8.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance =
       (DestroyInstanceFunc)0x0;
  local_1e8.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_1e8.supportedExtensions.
      super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.supportedExtensions.
                    super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.supportedExtensions.
                          super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.supportedExtensions.
                          super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSurfaceTest (Context& context, Type wsiType)
{
	const InstanceHelper		instHelper	(context, wsiType);
	const NativeObjects			native		(context, instHelper.supportedExtensions, wsiType);
	const Unique<VkSurfaceKHR>	surface		(createSurface(instHelper.vki, *instHelper.instance, wsiType, *native.display, *native.window));

	return tcu::TestStatus::pass("Creating surface succeeded");
}